

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O0

bool __thiscall bloaty::RangeMap::CoversRange(RangeMap *this,uint64_t addr,uint64_t size)

{
  bool bVar1;
  const_iterator cVar2;
  long in_RDX;
  _Base_ptr in_RSI;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *in_RDI;
  uint64_t end;
  const_iterator it;
  map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint64_t in_stack_ffffffffffffffc0;
  _Self in_stack_ffffffffffffffc8;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter;
  _Self local_28;
  long local_20;
  _Base_ptr local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28._M_node =
       (_Base_ptr)FindContaining(in_stack_ffffffffffffffc8._M_node,in_stack_ffffffffffffffc0);
  iter._M_node = (_Base_ptr)((long)&local_18->_M_color + local_20);
  if (iter._M_node < local_18) {
    __assert_fail("end >= addr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                  ,0x136,"bool bloaty::RangeMap::CoversRange(uint64_t, uint64_t) const");
  }
  while( true ) {
    if (iter._M_node <= local_18) {
      return true;
    }
    cVar2 = std::
            map<unsigned_long,_bloaty::RangeMap::Entry,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
            ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_28,(_Self *)&stack0xffffffffffffffc8);
    in_stack_ffffffffffffffa4 = CONCAT13(1,(int3)in_stack_ffffffffffffffa4);
    if (!bVar1) {
      bVar1 = EntryContains<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                        ((RangeMap *)cVar2._M_node,iter,(uint64_t)local_28._M_node);
      in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4) ^ 0xff000000;
    }
    if ((in_stack_ffffffffffffffa4 & 0x1000000) != 0) break;
    cVar2._M_node._4_4_ = in_stack_ffffffffffffffa4;
    cVar2._M_node._0_4_ = in_stack_ffffffffffffffa0;
    local_18 = (_Base_ptr)RangeEnd((RangeMap *)in_stack_ffffffffffffff98,cVar2);
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
    operator++(in_RDI,in_stack_ffffffffffffffa4);
  }
  return false;
}

Assistant:

bool RangeMap::CoversRange(uint64_t addr, uint64_t size) const {
  auto it = FindContaining(addr);
  uint64_t end = addr + size;
  assert(end >= addr);

  while (true) {
    if (addr >= end) {
      return true;
    } else if (it == mappings_.end() || !EntryContains(it, addr)) {
      return false;
    }
    addr = RangeEnd(it);
    it++;
  }
}